

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginGroup(void)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiGroupData *__dest;
  int iVar6;
  int iVar7;
  float fVar8;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  iVar1 = (GImGui->GroupStack).Size;
  iVar7 = iVar1 + 1;
  iVar2 = (GImGui->GroupStack).Capacity;
  if (iVar2 <= iVar1) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    if (iVar2 < iVar6) {
      __dest = (ImGuiGroupData *)MemAlloc((long)iVar6 * 0x38);
      pIVar4 = (pIVar5->GroupStack).Data;
      if (pIVar4 != (ImGuiGroupData *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar5->GroupStack).Size * 0x38);
        MemFree((pIVar5->GroupStack).Data);
      }
      (pIVar5->GroupStack).Data = __dest;
      (pIVar5->GroupStack).Capacity = iVar6;
    }
  }
  (pIVar5->GroupStack).Size = iVar7;
  pIVar4 = (pIVar5->GroupStack).Data;
  pIVar4[iVar1].WindowID = pIVar3->ID;
  pIVar4[iVar1].BackupCursorPos = (pIVar3->DC).CursorPos;
  pIVar4[iVar1].BackupCursorPosPrevLine = (pIVar3->DC).CursorPosPrevLine;
  pIVar4[iVar1].BackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
  pIVar4[iVar1].BackupIndent.x = (pIVar3->DC).Indent.x;
  pIVar4[iVar1].BackupGroupOffset.x = (pIVar3->DC).GroupOffset.x;
  pIVar4[iVar1].BackupCurrLineSize = (pIVar3->DC).CurrLineSize;
  pIVar4[iVar1].BackupCurrLineTextBaseOffset = (pIVar3->DC).CurrLineTextBaseOffset;
  pIVar4[iVar1].BackupActiveIdIsAlive = pIVar5->ActiveIdIsAlive;
  pIVar4[iVar1].BackupHoveredIdIsAlive = pIVar5->HoveredId != 0;
  pIVar4[iVar1].BackupIsSameLine = (pIVar3->DC).IsSameLine;
  pIVar4[iVar1].BackupActiveIdPreviousFrameIsAlive = pIVar5->ActiveIdPreviousFrameIsAlive;
  pIVar4[iVar1].EmitItem = true;
  fVar8 = ((pIVar3->DC).CursorPos.x - (pIVar3->Pos).x) - (pIVar3->DC).ColumnsOffset.x;
  (pIVar3->DC).GroupOffset.x = fVar8;
  (pIVar3->DC).Indent.x = fVar8;
  (pIVar3->DC).CursorMaxPos = (pIVar3->DC).CursorPos;
  (pIVar3->DC).CurrLineSize.x = 0.0;
  (pIVar3->DC).CurrLineSize.y = 0.0;
  if (pIVar5->LogEnabled == true) {
    pIVar5->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupIsSameLine = window->DC.IsSameLine;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}